

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationDeviceImpl.cpp
# Opt level: O3

void __thiscall
Diligent::SerializationDeviceImpl::~SerializationDeviceImpl(SerializationDeviceImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Char *pCVar2;
  long *plVar3;
  pointer pPVar4;
  pointer pcVar5;
  IDXCompiler *pIVar6;
  long lVar7;
  
  GLSLangUtils::FinalizeGlslang();
  lVar7 = 0x1d60;
  do {
    plVar3 = *(long **)((this->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).
                        m_AdapterInfo.Description + lVar7 + -0x20);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))();
      pCVar2 = (this->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).m_AdapterInfo
               .Description + lVar7 + -0x20;
      pCVar2[0] = '\0';
      pCVar2[1] = '\0';
      pCVar2[2] = '\0';
      pCVar2[3] = '\0';
      pCVar2[4] = '\0';
      pCVar2[5] = '\0';
      pCVar2[6] = '\0';
      pCVar2[7] = '\0';
    }
    lVar7 = lVar7 + -8;
  } while (lVar7 != 0x1d20);
  pPVar4 = (this->m_ResourceBindings).
           super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar4 != (pointer)0x0) {
    operator_delete(pPVar4,(long)(this->m_ResourceBindings).
                                 super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar4);
  }
  pcVar5 = (this->m_MtlProps).DumpFolder._M_dataplus._M_p;
  paVar1 = &(this->m_MtlProps).DumpFolder.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->m_MtlProps).MslPreprocessorCmd._M_dataplus._M_p;
  paVar1 = &(this->m_MtlProps).MslPreprocessorCmd.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->m_MtlProps).CompileOptionsIOS._M_dataplus._M_p;
  paVar1 = &(this->m_MtlProps).CompileOptionsIOS.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->m_MtlProps).CompileOptionsMacOS._M_dataplus._M_p;
  paVar1 = &(this->m_MtlProps).CompileOptionsMacOS.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pIVar6 = (this->m_pVkDxCompiler)._M_t.
           super___uniq_ptr_impl<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::IDXCompiler_*,_std::default_delete<Diligent::IDXCompiler>_>
           .super__Head_base<0UL,_Diligent::IDXCompiler_*,_false>._M_head_impl;
  if (pIVar6 != (IDXCompiler *)0x0) {
    (*pIVar6->_vptr_IDXCompiler[1])();
  }
  (this->m_pVkDxCompiler)._M_t.
  super___uniq_ptr_impl<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>._M_t.
  super__Tuple_impl<0UL,_Diligent::IDXCompiler_*,_std::default_delete<Diligent::IDXCompiler>_>.
  super__Head_base<0UL,_Diligent::IDXCompiler_*,_false>._M_head_impl = (IDXCompiler *)0x0;
  pIVar6 = (this->m_pDxCompiler)._M_t.
           super___uniq_ptr_impl<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::IDXCompiler_*,_std::default_delete<Diligent::IDXCompiler>_>
           .super__Head_base<0UL,_Diligent::IDXCompiler_*,_false>._M_head_impl;
  if (pIVar6 != (IDXCompiler *)0x0) {
    (*pIVar6->_vptr_IDXCompiler[1])();
  }
  (this->m_pDxCompiler)._M_t.
  super___uniq_ptr_impl<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>._M_t.
  super__Tuple_impl<0UL,_Diligent::IDXCompiler_*,_std::default_delete<Diligent::IDXCompiler>_>.
  super__Head_base<0UL,_Diligent::IDXCompiler_*,_false>._M_head_impl = (IDXCompiler *)0x0;
  RenderDeviceBase<Diligent::SerializationEngineImplTraits>::~RenderDeviceBase
            (&this->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>);
  return;
}

Assistant:

SerializationDeviceImpl::~SerializationDeviceImpl()
{
#if !DILIGENT_NO_GLSLANG
    GLSLangUtils::FinalizeGlslang();
#endif
}